

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmidl-read.c
# Opt level: O3

void on_declaration(tmidl_declaration_t *declaration,void *user_context)

{
  char *__s;
  ulong uVar1;
  
  printf("# %s\n",declaration->name);
  if (declaration->type == TMIDL_ITEM_OPAQUE) {
    __s = "Type: Opaque";
  }
  else {
    if (declaration->type != TMIDL_ITEM_INTERFACE) goto LAB_001014c1;
    __s = "Type: Interface";
  }
  puts(__s);
LAB_001014c1:
  if (declaration->functions_count != 0) {
    uVar1 = 0;
    do {
      printf("Function: %s\n",declaration->functions[uVar1]->name);
      uVar1 = uVar1 + 1;
    } while (uVar1 < declaration->functions_count);
  }
  putchar(10);
  return;
}

Assistant:

static void on_declaration(const tmidl_declaration_t *declaration, void *user_context)
{
    printf("# %s\n", declaration->name);

    switch (declaration->type) {
    case TMIDL_ITEM_OPAQUE:
        printf("Type: Opaque\n");
        break;
    case TMIDL_ITEM_INTERFACE:
        printf("Type: Interface\n");
        break;
    }

    for (size_t i = 0; i < declaration->functions_count; i++) {
        printf("Function: %s\n", declaration->functions[i]->name);
    }

    printf("\n");
}